

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_astDataType *
build_datatype(Context_conflict *ctx,int isconst,MOJOSHADER_astDataType *dt,
              MOJOSHADER_astScalarOrArray *soa)

{
  undefined4 uVar1;
  int iVar2;
  undefined1 local_50 [4];
  int ok;
  AstCalcData data;
  int c2;
  int c1;
  MOJOSHADER_astDataType *retval;
  MOJOSHADER_astScalarOrArray *soa_local;
  MOJOSHADER_astDataType *dt_local;
  Context_conflict *pCStack_18;
  int isconst_local;
  Context_conflict *ctx_local;
  
  _c2 = (Context_conflict *)0x0;
  retval = (MOJOSHADER_astDataType *)soa;
  soa_local = (MOJOSHADER_astScalarOrArray *)dt;
  dt_local._4_4_ = isconst;
  pCStack_18 = ctx;
  if (((soa->isarray == 0) || (soa->dimension == (MOJOSHADER_astExpression *)0x0)) &&
     ((soa->isarray != 0 || (soa->dimension != (MOJOSHADER_astExpression *)0x0)))) {
    __assert_fail("(soa->isarray && soa->dimension) || (!soa->isarray && !soa->dimension)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x790,
                  "const MOJOSHADER_astDataType *build_datatype(Context *, const int, const MOJOSHADER_astDataType *, MOJOSHADER_astScalarOrArray *)"
                 );
  }
  sanitize_datatype(ctx,dt);
  if (retval[1].type == MOJOSHADER_AST_DATATYPE_NONE) {
    data.value.i._4_4_ =
         ZEXT14(((soa_local->ast).type & 0x80000000) != MOJOSHADER_AST_OP_START_RANGE);
    data.value.i._0_4_ = ZEXT14(dt_local._4_4_ != 0);
    if (data.value.i._4_4_ == data.value.i._0_4_) {
      return (MOJOSHADER_astDataType *)soa_local;
    }
  }
  _c2 = (Context_conflict *)Malloc(pCStack_18,0x20);
  if (_c2 == (Context_conflict *)0x0) {
    ctx_local = (Context_conflict *)0x0;
  }
  else {
    iVar2 = buffer_append(pCStack_18->garbage,&c2,8);
    if (iVar2 == 0) {
      Free(pCStack_18,_c2);
      ctx_local = (Context_conflict *)0x0;
    }
    else if (retval[1].type == MOJOSHADER_AST_DATATYPE_NONE) {
      if (*(long *)((long)retval + 0x28) != 0) {
        __assert_fail("soa->dimension == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x7aa,
                      "const MOJOSHADER_astDataType *build_datatype(Context *, const int, const MOJOSHADER_astDataType *, MOJOSHADER_astScalarOrArray *)"
                     );
      }
      uVar1 = *(undefined4 *)&(soa_local->ast).field_0x4;
      _c2->isfail = (soa_local->ast).type;
      _c2->out_of_memory = uVar1;
      _c2->malloc = (MOJOSHADER_malloc)(soa_local->ast).filename;
      _c2->free = *(MOJOSHADER_free *)&(soa_local->ast).line;
      _c2->malloc_data = soa_local->identifier;
      if (dt_local._4_4_ == 0) {
        _c2->isfail = _c2->isfail & 0x7fffffff;
      }
      else {
        _c2->isfail = _c2->isfail | 0x80000000;
      }
      ctx_local = _c2;
    }
    else {
      _c2->isfail = 0x11;
      _c2->malloc = (MOJOSHADER_malloc)soa_local;
      if (*(long *)((long)retval + 0x28) == 0) {
        *(undefined4 *)&_c2->free = 0xffffffff;
        ctx_local = _c2;
      }
      else {
        local_50 = (undefined1  [4])0x0;
        data.isflt = 0;
        data._4_4_ = 0;
        *(undefined4 *)&_c2->free = 0x10;
        iVar2 = calc_ast_const_expr(pCStack_18,*(void **)((long)retval + 0x28),
                                    (AstCalcData *)local_50);
        pCStack_18->sourcefile = (char *)(retval->array).base;
        pCStack_18->sourceline = (retval->array).elements;
        if (iVar2 == 0) {
          fail(pCStack_18,"array dimensions not constant");
        }
        else if (local_50 == (undefined1  [4])0x0) {
          if ((long)data._0_8_ < 0) {
            fail(pCStack_18,"array dimensions negative");
          }
          else {
            *(int *)&_c2->free = data.isflt;
          }
        }
        else {
          fail(pCStack_18,"array dimensions not integer");
        }
        ctx_local = _c2;
      }
    }
  }
  return (MOJOSHADER_astDataType *)ctx_local;
}

Assistant:

static const MOJOSHADER_astDataType *build_datatype(Context *ctx,
                                            const int isconst,
                                            const MOJOSHADER_astDataType *dt,
                                            MOJOSHADER_astScalarOrArray *soa)
{
    MOJOSHADER_astDataType *retval = NULL;

    assert( (soa->isarray && soa->dimension) ||
            (!soa->isarray && !soa->dimension) );

    sanitize_datatype(ctx, dt);

    // see if we can just reuse the exist datatype.
    if (!soa->isarray)
    {
        const int c1 = (dt->type & MOJOSHADER_AST_DATATYPE_CONST) != 0;
        const int c2 = (isconst != 0);
        if (c1 == c2)
            return dt;  // reuse existing datatype!
    } // if

    retval = (MOJOSHADER_astDataType *) Malloc(ctx, sizeof (*retval));
    if (retval == NULL)
        return NULL;

    // !!! FIXME: this is hacky.
    if (!buffer_append(ctx->garbage, &retval, sizeof (retval)))
    {
        Free(ctx, retval);
        return NULL;
    } // if

    if (!soa->isarray)
    {
        assert(soa->dimension == NULL);
        memcpy(retval, dt, sizeof (MOJOSHADER_astDataType));
        if (isconst)
            retval->type |= MOJOSHADER_AST_DATATYPE_CONST;
        else
            retval->type &= ~MOJOSHADER_AST_DATATYPE_CONST;
        return retval;
    } // if

    retval->type = MOJOSHADER_AST_DATATYPE_ARRAY;
    retval->array.base = dt;
    if (soa->dimension == NULL)
    {
        retval->array.elements = -1;
        return retval;
    } // if

    // Run the expression to verify it's constant and produces a positive int.
    AstCalcData data;
    data.isflt = 0;
    data.value.i = 0;
    retval->array.elements = 16;  // sane default for failure.
    const int ok = calc_ast_const_expr(ctx, soa->dimension, &data);

    // reset error position.
    ctx->sourcefile = soa->ast.filename;
    ctx->sourceline = soa->ast.line;

    if (!ok)
        fail(ctx, "array dimensions not constant");
    else if (data.isflt)
        fail(ctx, "array dimensions not integer");
    else if (data.value.i < 0)
        fail(ctx, "array dimensions negative");
    else
        retval->array.elements = data.value.i;

    return retval;
}